

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O3

bool __thiscall
cmStringCommand::HandleRepeatCommand
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  size_type sVar3;
  cmMakefile *pcVar4;
  bool bVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  string result;
  unsigned_long times;
  string local_78;
  ulong local_58;
  long *local_50 [2];
  long local_40 [2];
  
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 == 0x80) {
    bVar5 = cmSystemTools::StringToULong(pbVar2[2]._M_dataplus._M_p,&local_58);
    if (bVar5) {
      pbVar2 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      sVar3 = pbVar2[1]._M_string_length;
      paVar1 = &local_78.field_2;
      local_78._M_string_length = 0;
      local_78.field_2._M_local_buf[0] = '\0';
      local_78._M_dataplus._M_p = (pointer)paVar1;
      if (sVar3 != 0) {
        if (sVar3 == 1) {
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct((ulong)local_50,(char)local_58);
          std::__cxx11::string::operator=((string *)&local_78,(string *)local_50);
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
        }
        else {
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct((ulong)local_50,(char)local_58 * (char)sVar3);
          std::__cxx11::string::operator=((string *)&local_78,(string *)local_50);
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
          if (local_58 != 0) {
            uVar7 = 1;
            uVar8 = 0;
            uVar6 = local_58;
            do {
              if (pbVar2[1]._M_string_length != 0) {
                memmove(local_78._M_dataplus._M_p + uVar8 * sVar3,pbVar2[1]._M_dataplus._M_p,
                        pbVar2[1]._M_string_length);
                uVar6 = local_58;
              }
              uVar8 = (ulong)uVar7;
              uVar7 = uVar7 + 1;
            } while (uVar8 < uVar6);
          }
        }
      }
      cmMakefile::AddDefinition
                ((this->super_cmCommand).Makefile,pbVar2 + 3,local_78._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p == paVar1) {
        return true;
      }
      goto LAB_0025b1eb;
    }
    pcVar4 = (this->super_cmCommand).Makefile;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"repeat count is not a positive number.","");
    cmMakefile::IssueMessage(pcVar4,FATAL_ERROR,&local_78);
  }
  else {
    pcVar4 = (this->super_cmCommand).Makefile;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"sub-command REPEAT requires three arguments.","");
    cmMakefile::IssueMessage(pcVar4,FATAL_ERROR,&local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p == &local_78.field_2) {
    return true;
  }
LAB_0025b1eb:
  operator_delete(local_78._M_dataplus._M_p,
                  CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                           local_78.field_2._M_local_buf[0]) + 1);
  return true;
}

Assistant:

bool cmStringCommand::HandleRepeatCommand(std::vector<std::string> const& args)
{
  // `string(REPEAT "<str>" <times> OUTPUT_VARIABLE)`
  enum ArgPos : std::size_t
  {
    SUB_COMMAND,
    VALUE,
    TIMES,
    OUTPUT_VARIABLE,
    TOTAL_ARGS
  };

  if (args.size() != ArgPos::TOTAL_ARGS) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      "sub-command REPEAT requires three arguments.");
    return true;
  }

  unsigned long times;
  if (!cmSystemTools::StringToULong(args[ArgPos::TIMES].c_str(), &times)) {
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                 "repeat count is not a positive number.");
    return true;
  }

  const auto& stringValue = args[ArgPos::VALUE];
  const auto& variableName = args[ArgPos::OUTPUT_VARIABLE];
  const auto inStringLength = stringValue.size();

  std::string result;
  switch (inStringLength) {
    case 0u:
      // Nothing to do for zero length input strings
      break;
    case 1u:
      // NOTE If the string to repeat consists of the only character,
      // use the appropriate constructor.
      result = std::string(times, stringValue[0]);
      break;
    default:
      result = std::string(inStringLength * times, char{});
      for (auto i = 0u; i < times; ++i) {
        std::copy(cm::cbegin(stringValue), cm::cend(stringValue),
                  &result[i * inStringLength]);
      }
      break;
  }

  this->Makefile->AddDefinition(variableName, result.c_str());
  return true;
}